

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O2

void __thiscall
QtMWidgets::DateTimePickerPrivate::drawWindow
          (DateTimePickerPrivate *this,QPainter *p,QStyleOption *opt)

{
  int h;
  int iVar1;
  QPalette *this_00;
  QColor *pQVar2;
  int y1;
  QColor QVar3;
  QBrush local_110 [8];
  QColor local_108;
  QColor baseColor;
  QPointF local_d8;
  QPointF local_c8;
  QLinearGradient g;
  QColor c1;
  undefined8 local_40;
  undefined4 local_38;
  undefined2 local_34;
  
  iVar1 = this->itemHeight / 4;
  h = (this->itemHeight + iVar1 * 2) / 2;
  iVar1 = this->currentItemY - iVar1;
  y1 = iVar1 + h * 2;
  this_00 = (QPalette *)QWidget::palette();
  pQVar2 = QPalette::color(this_00,Dark);
  baseColor._0_8_ = *(undefined8 *)pQVar2;
  baseColor._8_8_ = *(undefined8 *)((long)&pQVar2->ct + 4);
  c1._0_8_ = baseColor._0_8_;
  c1._8_8_ = baseColor._8_8_;
  QColor::setAlpha((int)&c1);
  QPainter::setPen((QColor *)p);
  QPainter::drawLine(p,0,iVar1,(*(int *)(opt + 0x18) - *(int *)(opt + 0x10)) + 1,iVar1);
  QPainter::drawLine(p,0,y1,(*(int *)(opt + 0x18) - *(int *)(opt + 0x10)) + 1,y1);
  QVar3 = lighterColor(&baseColor,0x6e);
  local_40 = QVar3._0_8_;
  local_38 = QVar3.ct._4_4_;
  local_34 = QVar3.ct._8_2_;
  QColor::setAlpha((int)&local_40);
  QPainter::setPen((QColor *)p);
  QPainter::drawLine(p,0,iVar1 + 1,(*(int *)(opt + 0x18) - *(int *)(opt + 0x10)) + 1,iVar1 + 2);
  local_c8.xp = 0.0;
  local_c8.yp = 0.0;
  local_d8.xp = 0.0;
  local_d8.yp._0_4_ = 0;
  local_d8.yp._4_4_ = 0x3ff00000;
  QLinearGradient::QLinearGradient(&g,&local_c8,&local_d8);
  QGradient::setCoordinateMode((CoordinateMode)&g);
  QVar3 = lighterColor(&baseColor,0x5f);
  local_c8.xp = QVar3._0_8_;
  local_c8.yp._0_6_ = QVar3.ct._4_6_;
  QColor::setAlpha((int)&local_c8);
  QGradient::setColorAt(0.0,(QColor *)&g);
  QVar3 = lighterColor(&baseColor,0x32);
  local_d8.xp = QVar3._0_8_;
  local_d8.yp._0_4_ = QVar3.ct._4_4_;
  local_d8.yp._4_4_ = CONCAT22(local_d8.yp._6_2_,QVar3.ct._8_2_);
  QColor::setAlpha((int)&local_d8);
  QGradient::setColorAt(1.0,(QColor *)&g);
  QPainter::setPen((PenStyle)p);
  QBrush::QBrush((QBrush *)&local_108,(QGradient *)&g);
  QPainter::setBrush((QBrush *)p);
  QBrush::~QBrush((QBrush *)&local_108);
  QPainter::drawRect(p,0,iVar1 + 2,(*(int *)(opt + 0x18) - *(int *)(opt + 0x10)) + 1,h + -2);
  QVar3 = lighterColor(&baseColor,0x23);
  local_108._0_8_ = QVar3._0_8_;
  local_108.ct._4_4_ = QVar3.ct._4_4_;
  local_108.ct.argb.pad = QVar3.ct._8_2_;
  QColor::setAlpha((int)&local_108);
  QBrush::QBrush(local_110,&local_108,SolidPattern);
  QPainter::setBrush((QBrush *)p);
  QBrush::~QBrush(local_110);
  QPainter::drawRect(p,0,iVar1 + h,(*(int *)(opt + 0x18) - *(int *)(opt + 0x10)) + 1,h);
  QLinearGradient::~QLinearGradient(&g);
  return;
}

Assistant:

void
DateTimePickerPrivate::drawWindow( QPainter * p, const QStyleOption & opt )
{
	const int windowOffset = itemHeight / 4;
	const int windowHeight = itemHeight + windowOffset * 2;
	const int windowMiddleHeight = windowHeight / 2;

	const int alpha = 150;
	const int alpha2 = 255;

	int yTop = currentItemY - windowOffset;
	int yBottom = yTop + windowMiddleHeight * 2;

	const QColor baseColor = q->palette().color( QPalette::Dark );

	QColor c1 = baseColor;
	c1.setAlpha( alpha2 );
	p->setPen( c1 );

	p->drawLine( 0, yTop, opt.rect.width(), yTop );
	p->drawLine( 0, yBottom, opt.rect.width(), yBottom );

	QColor c2 = lighterColor( baseColor, 110 );
	c2.setAlpha( alpha2 );
	p->setPen( c2 );

	p->drawLine( 0, yTop + 1, opt.rect.width(), yTop + 2 );

	QLinearGradient g( QPointF( 0.0, 0.0 ), QPointF( 0.0, 1.0 ) );
	g.setCoordinateMode( QGradient::ObjectBoundingMode );

	QColor c3 = lighterColor( baseColor, 95 );
	c3.setAlpha( alpha );
	g.setColorAt( 0.0, c3 );

	QColor c4 = lighterColor( baseColor, 50 );
	c4.setAlpha( alpha );
	g.setColorAt( 1.0, c4 );

	p->setPen( Qt::NoPen );
	p->setBrush( g );

	p->drawRect( 0, yTop + 2, opt.rect.width(), windowMiddleHeight - 2 );

	QColor c5 = lighterColor( baseColor, 35 );
	c5.setAlpha( alpha );
	p->setBrush( c5 );
	p->drawRect( 0, yTop + windowMiddleHeight,
		opt.rect.width(), windowMiddleHeight );
}